

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_builder.h
# Opt level: O2

void BuilderTests<GrpcLikeMessageBuilder,_GrpcLikeMessageBuilder>::builder_swap_after_finish_test
               (bool run)

{
  FlatBufferBuilder *builder;
  FlatBufferBuilder *builder_00;
  uint val;
  uint val_00;
  bool bVar1;
  Offset<MyGame::Example::Monster> OVar2;
  undefined7 in_register_00000039;
  string local_150;
  GrpcLikeMessageBuilder src;
  GrpcLikeMessageBuilder dst;
  
  if ((int)CONCAT71(in_register_00000039,run) != 0) {
    GrpcLikeMessageBuilder::GrpcLikeMessageBuilder(&src);
    builder = &src.super_FlatBufferBuilder;
    OVar2 = populate1(builder);
    flatbuffers::FlatBufferBuilderImpl<false>::Finish<MyGame::Example::Monster>
              (builder,OVar2,(char *)0x0);
    val = src.super_FlatBufferBuilder.buf_.size_;
    GrpcLikeMessageBuilder::GrpcLikeMessageBuilder(&dst);
    builder_00 = &dst.super_FlatBufferBuilder;
    OVar2 = populate2(builder_00);
    flatbuffers::FlatBufferBuilderImpl<false>::Finish<MyGame::Example::Monster>
              (builder_00,OVar2,(char *)0x0);
    val_00 = dst.super_FlatBufferBuilder.buf_.size_;
    GrpcLikeMessageBuilder::Swap(&src,&dst);
    TestEq<unsigned_int,unsigned_int>
              (src.super_FlatBufferBuilder.buf_.size_,val_00,"\'src.GetSize()\' != \'size2\'",
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test_builder.h"
               ,0xc5,
               "static void BuilderTests<GrpcLikeMessageBuilder>::builder_swap_after_finish_test(bool) [DestBuilder = GrpcLikeMessageBuilder, SrcBuilder = GrpcLikeMessageBuilder]"
              );
    TestEq<unsigned_int,unsigned_int>
              (dst.super_FlatBufferBuilder.buf_.size_,val,"\'dst.GetSize()\' != \'size1\'",
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test_builder.h"
               ,0xc6,
               "static void BuilderTests<GrpcLikeMessageBuilder>::builder_swap_after_finish_test(bool) [DestBuilder = GrpcLikeMessageBuilder, SrcBuilder = GrpcLikeMessageBuilder]"
              );
    m2_name_abi_cxx11_();
    bVar1 = release_n_verify(builder,&local_150,Color_Green);
    TestEq<bool,bool>(true,bVar1,"\'true\' != \'release_n_verify(src, m2_name(), m2_color())\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test_builder.h"
                      ,199,
                      "static void BuilderTests<GrpcLikeMessageBuilder>::builder_swap_after_finish_test(bool) [DestBuilder = GrpcLikeMessageBuilder, SrcBuilder = GrpcLikeMessageBuilder]"
                     );
    std::__cxx11::string::~string((string *)&local_150);
    m1_name_abi_cxx11_();
    bVar1 = release_n_verify(builder_00,&local_150,Color_Red);
    TestEq<bool,bool>(true,bVar1,"\'true\' != \'release_n_verify(dst, m1_name(), m1_color())\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test_builder.h"
                      ,200,
                      "static void BuilderTests<GrpcLikeMessageBuilder>::builder_swap_after_finish_test(bool) [DestBuilder = GrpcLikeMessageBuilder, SrcBuilder = GrpcLikeMessageBuilder]"
                     );
    std::__cxx11::string::~string((string *)&local_150);
    flatbuffers::FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl(builder_00);
    flatbuffers::FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl(builder);
  }
  return;
}

Assistant:

static void builder_swap_after_finish_test(
      bool run = std::is_same<DestBuilder, SrcBuilder>::value) {
    /// Swap is allowed only when lhs and rhs are the same concrete type.
    if (run) {
      SrcBuilder src;
      auto root_offset1 = populate1(src);
      src.Finish(root_offset1);
      auto size1 = src.GetSize();
      DestBuilder dst;
      auto root_offset2 = populate2(dst);
      dst.Finish(root_offset2);
      auto size2 = dst.GetSize();
      src.Swap(dst);
      TEST_EQ_FUNC(src.GetSize(), size2);
      TEST_EQ_FUNC(dst.GetSize(), size1);
      TEST_ASSERT_FUNC(release_n_verify(src, m2_name(), m2_color()));
      TEST_ASSERT_FUNC(release_n_verify(dst, m1_name(), m1_color()));
    }
  }